

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_delphi_generator.cc
# Opt level: O2

void __thiscall
t_delphi_generator::generate_deserialize_field
          (t_delphi_generator *this,ostream *out,bool is_xception,t_field *tfield,string *prefix,
          ostream *param_5)

{
  uint uVar1;
  pointer pcVar2;
  int iVar3;
  t_struct *tstruct;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  string *this_00;
  undefined1 auVar7 [12];
  string local_d8;
  string name;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)tfield->type_;
  while (iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[9])(tstruct), (char)iVar3 != '\0'
        ) {
    tstruct = (t_struct *)t_typedef::get_type((t_typedef *)tstruct);
  }
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar3 != '\0') {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&name,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar5,&name,&tfield->name_);
    __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  prop_name_abi_cxx11_(&local_d8,this,tfield,is_xception);
  std::operator+(&name,prefix,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar3 == '\0')
     ) {
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
      if (((char)iVar3 != '\0') ||
         (iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct),
         (char)iVar3 != '\0')) {
        poVar4 = indent_impl(this,out);
        poVar4 = std::operator<<(poVar4,(string *)&name);
        std::operator<<(poVar4," := ");
        iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
        if ((char)iVar3 != '\0') {
          type_name_abi_cxx11_(&local_d8,this,&tstruct->super_t_type,false,false,false,false);
          poVar4 = std::operator<<(out,(string *)&local_d8);
          std::operator<<(poVar4,"(");
          std::__cxx11::string::~string((string *)&local_d8);
        }
        std::operator<<(out,"iprot.");
        iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
        if ((char)iVar3 == '\0') {
          iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
          if ((char)iVar3 != '\0') {
            std::operator<<(out,"ReadI32()");
            std::operator<<(out,");");
          }
        }
        else {
          uVar1 = *(uint *)&(tstruct->members_).
                            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                            super__Vector_impl_data._M_start;
          switch(uVar1) {
          case 0:
            pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",&name)
            ;
            __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          case 1:
            iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[7])(tstruct);
            if ((char)iVar3 == '\0') {
              pcVar6 = "ReadString();";
            }
            else {
              pcVar6 = "ReadBinary();";
              if (this->ansistr_binary_ != false) {
                pcVar6 = "ReadAnsiString();";
              }
            }
            break;
          case 2:
            pcVar6 = "ReadBool();";
            break;
          case 3:
            pcVar6 = "ReadByte();";
            break;
          case 4:
            pcVar6 = "ReadI16();";
            break;
          case 5:
            pcVar6 = "ReadI32();";
            break;
          case 6:
            pcVar6 = "ReadI64();";
            break;
          case 7:
            pcVar6 = "ReadDouble();";
            break;
          default:
            auVar7 = __cxa_allocate_exception(0x20);
            t_base_type::t_base_name_abi_cxx11_(&local_d8,(t_base_type *)(ulong)uVar1,auVar7._8_4_);
            std::operator+(auVar7._0_8_,"compiler error: no Delphi name for base type ",&local_d8);
            __cxa_throw(auVar7._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          std::operator<<(out,pcVar6);
        }
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
        goto LAB_001b196e;
      }
      pcVar2 = (tfield->name_)._M_dataplus._M_p;
      type_name_abi_cxx11_(&local_d8,this,&tstruct->super_t_type,false,false,false,false);
      this_00 = &local_d8;
      printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar2,
             local_d8._M_dataplus._M_p);
    }
    else {
      std::__cxx11::string::string((string *)&local_90,(string *)&name);
      generate_deserialize_container(this,out,is_xception,&tstruct->super_t_type,&local_90,param_5);
      this_00 = &local_90;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_50,(string *)&name);
    std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_d8);
    generate_deserialize_struct(this,out,tstruct,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001b196e:
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void t_delphi_generator::generate_deserialize_field(ostream& out,
                                                    bool is_xception,
                                                    t_field* tfield,
                                                    string prefix,
                                                    ostream& local_vars) {
  t_type* type = tfield->get_type();
  while (type->is_typedef()) {
    type = ((t_typedef*)type)->get_type();
  }

  if (type->is_void()) {
    throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  string name = prefix + prop_name(tfield, is_xception);

  if (type->is_struct() || type->is_xception()) {
    generate_deserialize_struct(out, (t_struct*)type, name, "");
  } else if (type->is_container()) {
    generate_deserialize_container(out, is_xception, type, name, local_vars);
  } else if (type->is_base_type() || type->is_enum()) {
    indent_impl(out) << name << " := ";

    if (type->is_enum()) {
      out << type_name(type, false) << "(";
    }

    out << "iprot.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          if (ansistr_binary_) {
            out << "ReadAnsiString();";
          } else {
            out << "ReadBinary();";
          }
        } else {
          out << "ReadString();";
        }
        break;
      case t_base_type::TYPE_BOOL:
        out << "ReadBool();";
        break;
      case t_base_type::TYPE_I8:
        out << "ReadByte();";
        break;
      case t_base_type::TYPE_I16:
        out << "ReadI16();";
        break;
      case t_base_type::TYPE_I32:
        out << "ReadI32();";
        break;
      case t_base_type::TYPE_I64:
        out << "ReadI64();";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "ReadDouble();";
        break;
      default:
        throw "compiler error: no Delphi name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "ReadI32()";
      out << ");";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type_name(type).c_str());
  }
}